

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

Wtxid * __thiscall
CTransaction::ComputeWitnessHash(Wtxid *__return_storage_ptr__,CTransaction *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  ParamsStream<HashWriter_&,_TransactionSerParams> local_98;
  CSHA256 local_88;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_has_witness == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      uVar1 = *(undefined8 *)(this->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar2 = *(undefined8 *)((this->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar3 = *(undefined8 *)((this->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       ((__return_storage_ptr__->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10) =
           *(undefined8 *)((this->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       ((__return_storage_ptr__->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar3;
      *(undefined8 *)(__return_storage_ptr__->m_wrapped).super_base_blob<256U>.m_data._M_elems =
           uVar1;
      *(undefined8 *)((__return_storage_ptr__->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8)
           = uVar2;
      return __return_storage_ptr__;
    }
  }
  else {
    local_88.buf[0x30] = '\0';
    local_88.buf[0x31] = '\0';
    local_88.buf[0x32] = '\0';
    local_88.buf[0x33] = '\0';
    local_88.buf[0x34] = '\0';
    local_88.buf[0x35] = '\0';
    local_88.buf[0x36] = '\0';
    local_88.buf[0x37] = '\0';
    local_88.buf[0x38] = '\0';
    local_88.buf[0x39] = '\0';
    local_88.buf[0x3a] = '\0';
    local_88.buf[0x3b] = '\0';
    local_88.buf[0x3c] = '\0';
    local_88.buf[0x3d] = '\0';
    local_88.buf[0x3e] = '\0';
    local_88.buf[0x3f] = '\0';
    local_88.buf[0x20] = '\0';
    local_88.buf[0x21] = '\0';
    local_88.buf[0x22] = '\0';
    local_88.buf[0x23] = '\0';
    local_88.buf[0x24] = '\0';
    local_88.buf[0x25] = '\0';
    local_88.buf[0x26] = '\0';
    local_88.buf[0x27] = '\0';
    local_88.buf[0x28] = '\0';
    local_88.buf[0x29] = '\0';
    local_88.buf[0x2a] = '\0';
    local_88.buf[0x2b] = '\0';
    local_88.buf[0x2c] = '\0';
    local_88.buf[0x2d] = '\0';
    local_88.buf[0x2e] = '\0';
    local_88.buf[0x2f] = '\0';
    local_88.buf[0x10] = '\0';
    local_88.buf[0x11] = '\0';
    local_88.buf[0x12] = '\0';
    local_88.buf[0x13] = '\0';
    local_88.buf[0x14] = '\0';
    local_88.buf[0x15] = '\0';
    local_88.buf[0x16] = '\0';
    local_88.buf[0x17] = '\0';
    local_88.buf[0x18] = '\0';
    local_88.buf[0x19] = '\0';
    local_88.buf[0x1a] = '\0';
    local_88.buf[0x1b] = '\0';
    local_88.buf[0x1c] = '\0';
    local_88.buf[0x1d] = '\0';
    local_88.buf[0x1e] = '\0';
    local_88.buf[0x1f] = '\0';
    local_88.buf[0] = '\0';
    local_88.buf[1] = '\0';
    local_88.buf[2] = '\0';
    local_88.buf[3] = '\0';
    local_88.buf[4] = '\0';
    local_88.buf[5] = '\0';
    local_88.buf[6] = '\0';
    local_88.buf[7] = '\0';
    local_88.buf[8] = '\0';
    local_88.buf[9] = '\0';
    local_88.buf[10] = '\0';
    local_88.buf[0xb] = '\0';
    local_88.buf[0xc] = '\0';
    local_88.buf[0xd] = '\0';
    local_88.buf[0xe] = '\0';
    local_88.buf[0xf] = '\0';
    local_88.s[4] = 0;
    local_88.s[5] = 0;
    local_88.s[6] = 0;
    local_88.s[7] = 0;
    local_88.s[0] = 0;
    local_88.s[1] = 0;
    local_88.s[2] = 0;
    local_88.s[3] = 0;
    local_88.bytes = 0;
    CSHA256::CSHA256(&local_88);
    local_98.m_params = &TX_WITH_WITNESS;
    local_98.m_substream = (HashWriter *)&local_88;
    SerializeTransaction<ParamsStream<HashWriter&,TransactionSerParams>,CTransaction>
              (this,&local_98,&TX_WITH_WITNESS);
    HashWriter::GetHash(&__return_storage_ptr__->m_wrapped,(HashWriter *)&local_88);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

Wtxid CTransaction::ComputeWitnessHash() const
{
    if (!HasWitness()) {
        return Wtxid::FromUint256(hash.ToUint256());
    }

    return Wtxid::FromUint256((HashWriter{} << TX_WITH_WITNESS(*this)).GetHash());
}